

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRleCompressor.cpp
# Opt level: O2

int __thiscall
Imf_2_5::RleCompressor::compress(RleCompressor *this,char *inPtr,int inSize,int minY,char **outPtr)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char cVar4;
  char *pcVar5;
  
  if (inSize == 0) {
    *outPtr = this->_outBuffer;
    return 0;
  }
  pcVar5 = this->_tmpBuffer;
  pcVar3 = inPtr + inSize;
  for (; inPtr < pcVar3; inPtr = inPtr + 2) {
    *pcVar5 = *inPtr;
    if (pcVar3 <= inPtr + 1) break;
    pcVar5[(inSize + 1) / 2] = inPtr[1];
    pcVar5 = pcVar5 + 1;
  }
  pcVar3 = this->_tmpBuffer;
  pcVar5 = pcVar3 + inSize;
  cVar4 = *pcVar3;
  while (pcVar3 = pcVar3 + 1, pcVar3 < pcVar5) {
    cVar1 = *pcVar3;
    *pcVar3 = (cVar1 - cVar4) + -0x80;
    cVar4 = cVar1;
  }
  pcVar3 = this->_outBuffer;
  *outPtr = pcVar3;
  iVar2 = rleCompress(inSize,this->_tmpBuffer,pcVar3);
  return iVar2;
}

Assistant:

int
RleCompressor::compress (const char *inPtr,
			 int inSize,
			 int minY,
			 const char *&outPtr)
{
    //
    // Special case �- empty input buffer
    //

    if (inSize == 0)
    {
	outPtr = _outBuffer;
	return 0;
    }

    //
    // Reorder the pixel data.
    //

    {
	char *t1 = _tmpBuffer;
	char *t2 = _tmpBuffer + (inSize + 1) / 2;
	const char *stop = inPtr + inSize;

	while (true)
	{
	    if (inPtr < stop)
		*(t1++) = *(inPtr++);
	    else
		break;

	    if (inPtr < stop)
		*(t2++) = *(inPtr++);
	    else
		break;
	}
    }

    //
    // Predictor.
    //

    {
	unsigned char *t = (unsigned char *) _tmpBuffer + 1;
	unsigned char *stop = (unsigned char *) _tmpBuffer + inSize;
	int p = t[-1];

	while (t < stop)
	{
	    int d = int (t[0]) - p + (128 + 256);
	    p = t[0];
	    t[0] = d;
	    ++t;
	}
    }

    //
    // Run-length encode the data.
    //

    outPtr = _outBuffer;
    return rleCompress (inSize, _tmpBuffer, (signed char *) _outBuffer);
}